

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token_handler.cpp
# Opt level: O3

Token * __thiscall TokenReader::peek(Token *__return_storage_ptr__,TokenReader *this)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  
  __return_storage_ptr__->type = NONE_TYPE;
  (__return_storage_ptr__->val)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->val).field_2;
  (__return_storage_ptr__->val)._M_string_length = 0;
  (__return_storage_ptr__->val).field_2._M_local_buf[0] = '\0';
  lVar1 = *(long *)this;
  if ((lVar1 != *(long *)(this + 8)) &&
     (uVar2 = (ulong)*(int *)(this + 0x18),
     uVar3 = (*(long *)(this + 8) - lVar1 >> 3) * -0x3333333333333333,
     uVar2 <= uVar3 && uVar3 - uVar2 != 0)) {
    __return_storage_ptr__->type = *(TokenType *)(lVar1 + uVar2 * 0x28);
    std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->val);
  }
  return __return_storage_ptr__;
}

Assistant:

Token TokenReader::peek()
{
    Token token;
    if (!m_tokenList.empty() && pos < m_tokenList.size()) {
        token = m_tokenList[pos];
    }
    return token;
}